

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O0

char * al_get_new_window_title(void)

{
  thread_local_state *ptVar1;
  size_t sVar2;
  thread_local_state *tls;
  char *local_8;
  
  ptVar1 = tls_get();
  if (ptVar1 == (thread_local_state *)0x0) {
    local_8 = al_get_app_name();
  }
  else {
    sVar2 = strlen(ptVar1->new_window_title);
    if (sVar2 == 0) {
      local_8 = al_get_app_name();
    }
    else {
      local_8 = ptVar1->new_window_title;
    }
  }
  return local_8;
}

Assistant:

const char *al_get_new_window_title(void)
{
   thread_local_state *tls;

   /* Return app name in case of error or if not set before. */
   if ((tls = tls_get()) == NULL)
      return al_get_app_name();

   if (strlen(tls->new_window_title) < 1)
      return al_get_app_name();


   return (const char *)tls->new_window_title;
}